

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O3

void Gia_ManInseFindStarting(Gia_Man_t *p,int iPat,Vec_Int_t *vInit,Vec_Int_t *vInputs)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  
  vInit->nSize = 0;
  iVar8 = p->nRegs;
  iVar3 = iPat >> 5;
  if (0 < iVar8) {
    uVar12 = 1 << ((byte)iPat & 0x1f);
    iVar7 = 0;
    do {
      iVar4 = p->vCos->nSize;
      uVar5 = (iVar4 - iVar8) + iVar7;
      if (((int)uVar5 < 0) || (iVar4 <= (int)uVar5)) goto LAB_005a0863;
      iVar4 = p->vCos->pArray[uVar5];
      if ((iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_005a0844;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      lVar2 = (long)p->iData;
      iVar4 = iVar4 * p->iData;
      pvVar1 = p->pData;
      lVar13 = lVar2 * 8 + (long)(iVar4 * 2) * 8;
      if (0 < lVar2) {
        lVar9 = 0;
        do {
          if ((*(ulong *)((long)pvVar1 + lVar9 * 8 + (long)(iVar4 * 2) * 8) &
              *(ulong *)((long)pvVar1 + lVar9 * 8 + lVar13)) != 0) {
            __assert_fail("(pData0[i] & pData1[i]) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                          ,0xd1,
                          "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar2 != lVar9);
      }
      iVar8 = 0;
      if ((*(uint *)((long)pvVar1 + (long)iVar3 * 4 + (long)(iVar4 * 2) * 8) & uVar12) == 0) {
        iVar8 = ((*(uint *)((long)pvVar1 + (long)iVar3 * 4 + lVar13) & uVar12) == 0) + 1;
      }
      Vec_IntPush(vInit,iVar8);
      iVar7 = iVar7 + 1;
      iVar8 = p->nRegs;
    } while (iVar7 < iVar8);
  }
  pVVar6 = p->vCis;
  uVar11 = (ulong)(uint)pVVar6->nSize;
  if (iVar8 < pVVar6->nSize) {
    uVar12 = 1 << ((byte)iPat & 0x1f);
    lVar13 = 0;
    do {
      if ((int)uVar11 <= lVar13) {
LAB_005a0863:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = pVVar6->pArray[lVar13];
      if ((iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_005a0844:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar9 = (long)p->iData;
      iVar8 = iVar8 * p->iData;
      pvVar1 = p->pData;
      lVar2 = lVar9 * 8 + (long)(iVar8 * 2) * 8;
      if (0 < lVar9) {
        lVar10 = 0;
        do {
          if ((*(ulong *)((long)pvVar1 + lVar10 * 8 + (long)(iVar8 * 2) * 8) &
              *(ulong *)((long)pvVar1 + lVar10 * 8 + lVar2)) != 0) {
            __assert_fail("(pData0[i] & pData1[i]) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                          ,0xde,
                          "void Gia_ManInseFindStarting(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
      }
      iVar7 = 0;
      if ((*(uint *)((long)pvVar1 + (long)iVar3 * 4 + (long)(iVar8 * 2) * 8) & uVar12) == 0) {
        iVar7 = ((*(uint *)((long)pvVar1 + (long)iVar3 * 4 + lVar2) & uVar12) == 0) + 1;
      }
      Vec_IntPush(vInputs,iVar7);
      lVar13 = lVar13 + 1;
      pVVar6 = p->vCis;
      uVar11 = (ulong)pVVar6->nSize;
    } while (lVar13 < (long)(uVar11 - (long)p->nRegs));
  }
  return;
}

Assistant:

void Gia_ManInseFindStarting( Gia_Man_t * p, int iPat, Vec_Int_t * vInit, Vec_Int_t * vInputs )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int i, k;
    Vec_IntClear( vInit );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInit, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInit, 1 );
        else 
            Vec_IntPush( vInit, 2 );
    }
    Gia_ManForEachPi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            assert( (pData0[i] & pData1[i]) == 0 );
        if ( Abc_InfoHasBit( (unsigned *)pData0, iPat ) )
            Vec_IntPush( vInputs, 0 );
        else if ( Abc_InfoHasBit( (unsigned *)pData1, iPat ) )
            Vec_IntPush( vInputs, 1 );
        else 
            Vec_IntPush( vInputs, 2 );
    }
}